

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Print.cpp
# Opt level: O0

void __thiscall
wasm::PrintExpressionContents::visitTupleMake(PrintExpressionContents *this,TupleMake *curr)

{
  ostream *poVar1;
  size_t sVar2;
  string_view local_28;
  TupleMake *local_18;
  TupleMake *curr_local;
  PrintExpressionContents *this_local;
  
  poVar1 = this->o;
  local_18 = curr;
  curr_local = (TupleMake *)this;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_28,"tuple.make ");
  printMedium(poVar1,local_28);
  poVar1 = this->o;
  sVar2 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::size
                    (&(local_18->operands).
                      super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>);
  std::ostream::operator<<(poVar1,sVar2);
  return;
}

Assistant:

void visitTupleMake(TupleMake* curr) {
    printMedium(o, "tuple.make ");
    o << curr->operands.size();
  }